

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

bool storage::BTree::check_(BTNode *nd)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  BTNode::get_right_brother(nd);
  BTNode::get_left_brother(nd);
  iVar1 = nd->used_links_count_;
  bVar5 = iVar1 < 3;
  if (2 < iVar1) {
    if (nd->keys_[1] <= nd->keys_[0]) goto LAB_00105a59;
    lVar2 = 0;
    iVar3 = nd->keys_[1];
    do {
      lVar4 = lVar2;
      if ((ulong)(iVar1 - 1) - 2 == lVar4) break;
      bVar5 = iVar3 < nd->keys_[lVar4 + 2];
      lVar2 = lVar4 + 1;
      iVar3 = nd->keys_[lVar4 + 2];
    } while (bVar5);
    bVar5 = (ulong)(iVar1 - 1) <= lVar4 + 2U;
  }
  if (bVar5) {
    if (nd->parent_ == (BTNode *)0x0) {
      if (iVar1 < 2) {
        return false;
      }
    }
    else if (iVar1 < 0x19) {
      return false;
    }
    iVar1 = (**nd->_vptr_BTNode)(nd);
    bVar5 = true;
    if (((char)iVar1 == '\0') &&
       (lVar2 = __dynamic_cast(nd,&BTNode::typeinfo,&BTInnerNode::typeinfo,0),
       0 < *(int *)(lVar2 + 0xdc))) {
      lVar4 = 0;
      do {
        bVar5 = check_(*(BTNode **)(lVar2 + 0xe0 + lVar4 * 8));
        if (!bVar5) {
          return bVar5;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < *(int *)(lVar2 + 0xdc));
    }
    return bVar5;
  }
LAB_00105a59:
  __assert_fail("cc(nd->keys_, nd->key_count())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x160,"static bool storage::BTree::check_(BTNode *)");
}

Assistant:

bool BTree::check_(BTNode *nd) {
        nd->get_right_brother();
        nd->get_left_brother();
        assert(cc(nd->keys_, nd->key_count()));
        BTNode *node = nd;
        if (!node->parent_) {
            if (node->used_links_count_ < 2)
                return false;
        } else {
            if (!node->check())
                return false;
        }
        if (!node->is_leaf_node()) {
            auto inner_node = dynamic_cast<BTInnerNode *>(node);
            for (int i = 0; i < inner_node->used_links_count_; ++i) {
                if (!check_(inner_node->links_[i]))
                    return false;
            }
        }
        return true;
    }